

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

float nk_widget_height(nk_context *ctx)

{
  float fVar1;
  nk_rect bounds;
  nk_rect nStack_18;
  
  fVar1 = 0.0;
  if ((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) {
    nk_layout_peek(&nStack_18,ctx);
    fVar1 = nStack_18.h;
  }
  return fVar1;
}

Assistant:

NK_API float
nk_widget_height(struct nk_context *ctx)
{
struct nk_rect bounds;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
if (!ctx || !ctx->current)
return 0;

nk_layout_peek(&bounds, ctx);
return bounds.h;
}